

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypedefNameTypeResolver.cpp
# Opt level: O2

Type * __thiscall psy::C::TypedefNameTypeResolver::resolve(TypedefNameTypeResolver *this,Type *ty)

{
  TypeKind TVar1;
  int iVar2;
  int iVar3;
  undefined4 extraout_var;
  TypedefDeclarationSymbol *this_00;
  FunctionType *this_01;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  Type *pTVar4;
  Type *pTVar5;
  undefined4 extraout_var_04;
  Compilation *this_02;
  long lVar6;
  size_type idx;
  size_type idx_00;
  _Vector_base<const_psy::C::Type_*,_std::allocator<const_psy::C::Type_*>_> local_48;
  undefined4 extraout_var_00;
  
  do {
    TVar1 = Type::kind(ty);
    switch(TVar1) {
    case Array:
      iVar2 = (*ty->_vptr_Type[3])(ty);
      pTVar4 = ArrayType::elementType((ArrayType *)CONCAT44(extraout_var_02,iVar2));
      pTVar5 = resolve(this,pTVar4);
      if (pTVar5 != pTVar4) {
        ArrayType::resetElementType((ArrayType *)CONCAT44(extraout_var_02,iVar2),pTVar5);
      }
    default:
      return ty;
    case Function:
      iVar2 = (*ty->_vptr_Type[7])(ty);
      this_01 = (FunctionType *)CONCAT44(extraout_var_00,iVar2);
      pTVar4 = FunctionType::returnType(this_01);
      pTVar5 = resolve(this,pTVar4);
      if (pTVar5 != pTVar4) {
        FunctionType::setReturnType(this_01,pTVar5);
      }
      FunctionType::parameterTypes
                ((vector<const_psy::C::Type_*,_std::allocator<const_psy::C::Type_*>_> *)&local_48,
                 this_01);
      lVar6 = (long)local_48._M_impl.super__Vector_impl_data._M_finish -
              (long)local_48._M_impl.super__Vector_impl_data._M_start;
      for (idx_00 = 0; lVar6 >> 3 != idx_00; idx_00 = idx_00 + 1) {
        pTVar4 = local_48._M_impl.super__Vector_impl_data._M_start[idx_00];
        pTVar5 = resolve(this,pTVar4);
        if (pTVar5 != pTVar4) {
          FunctionType::setParameterType(this_01,idx_00,pTVar5);
        }
      }
      std::_Vector_base<const_psy::C::Type_*,_std::allocator<const_psy::C::Type_*>_>::~_Vector_base
                (&local_48);
      return ty;
    case Pointer:
      iVar2 = (*ty->_vptr_Type[9])(ty);
      pTVar4 = PointerType::referencedType((PointerType *)CONCAT44(extraout_var_01,iVar2));
      pTVar5 = resolve(this,pTVar4);
      if (pTVar5 == pTVar4) {
        return ty;
      }
      PointerType::resetReferencedType((PointerType *)CONCAT44(extraout_var_01,iVar2),pTVar5);
      return ty;
    case TypedefName:
      iVar2 = (*ty->_vptr_Type[0xb])(ty);
      this_00 = TypedefNameType::declaration((TypedefNameType *)CONCAT44(extraout_var,iVar2));
      if (this_00 == (TypedefDeclarationSymbol *)0x0) {
        this_02 = SemanticModel::compilation(this->semaModel_);
        pTVar4 = &Compilation::canonicalErrorType(this_02)->super_Type;
        return pTVar4;
      }
      ty = TypedefDeclarationSymbol::synonymizedType(this_00);
      break;
    case Qualified:
      iVar2 = (*ty->_vptr_Type[0x11])(ty);
      pTVar4 = QualifiedType::unqualifiedType((QualifiedType *)CONCAT44(extraout_var_03,iVar2));
      pTVar5 = resolve(this,pTVar4);
      if (pTVar5 == pTVar4) {
        return ty;
      }
      TVar1 = Type::kind(pTVar5);
      if (TVar1 == Qualified) {
        iVar3 = (*pTVar5->_vptr_Type[0x11])(pTVar5);
        pTVar5 = QualifiedType::unqualifiedType((QualifiedType *)CONCAT44(extraout_var_04,iVar3));
      }
      QualifiedType::resetUnqualifiedType((QualifiedType *)CONCAT44(extraout_var_03,iVar2),pTVar5);
      return ty;
    }
  } while( true );
}

Assistant:

const Type* TypedefNameTypeResolver::resolve(const Type* ty)
{
    switch (ty->kind()) {
        case TypeKind::Basic:
        case TypeKind::Void:
        case TypeKind::Tag:
        case TypeKind::Error:
            break;

        case TypeKind::Array: {
            auto arrTy = ty->asArrayType();
            auto elemTy = arrTy->elementType();
            auto resolvedTy = resolve(elemTy);
            if (resolvedTy != elemTy)
                arrTy->resetElementType(resolvedTy);
            break;
        }

        case TypeKind::Function: {
            auto funcTy = ty->asFunctionType();
            auto retTy = funcTy->returnType();
            auto resolvedTy = resolve(retTy);
            if (resolvedTy != retTy)
                funcTy->setReturnType(resolvedTy);
            const auto parms = funcTy->parameterTypes();
            const auto parmsSize = parms.size();
            for (FunctionType::ParameterTypes::size_type idx = 0; idx < parmsSize; ++idx) {
                const Type* parmTy = parms[idx];
                resolvedTy = resolve(parmTy);
                if (resolvedTy != parmTy)
                    funcTy->setParameterType(idx, resolvedTy);
            }
            break;
        }

        case TypeKind::Pointer: {
            auto ptrTy = ty->asPointerType();
            auto refedTy = ptrTy->referencedType();
            auto resolvedTy = resolve(refedTy);
            if (resolvedTy != refedTy)
                ptrTy->resetReferencedType(resolvedTy);
            break;
        }

        case TypeKind::TypedefName: {
            auto tydefNameTy = ty->asTypedefNameType();
            auto tydefDecl = tydefNameTy->declaration();
            if (!tydefDecl)
                return semaModel_->compilation()->canonicalErrorType();
            return resolve(tydefDecl->synonymizedType());
        }

        case TypeKind::Qualified: {
            auto qualTy = ty->asQualifiedType();
            auto unqualTy = qualTy->unqualifiedType();
            auto resolvedTy = resolve(unqualTy);
            if (resolvedTy != unqualTy) {
                qualTy->resetUnqualifiedType(
                        resolvedTy->kind() == TypeKind::Qualified
                            ? resolvedTy->asQualifiedType()->unqualifiedType()
                            : resolvedTy);
            }
            break;
        }
    }

    return ty;
}